

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::create_look_ups(jpeg_decoder *this)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  
  iVar6 = 2;
  iVar7 = 3;
  iVar8 = 0;
  iVar9 = 1;
  lVar5 = -0x100;
  do {
    iVar10 = iVar8 + -0x80;
    iVar11 = iVar9 + -0x80;
    iVar12 = iVar6 + -0x80;
    iVar13 = iVar7 + -0x80;
    auVar2._4_4_ = iVar11;
    auVar2._0_4_ = iVar10;
    auVar2._8_4_ = iVar12;
    auVar2._12_4_ = iVar13;
    auVar14._4_4_ = iVar11;
    auVar14._0_4_ = iVar11;
    auVar14._8_4_ = iVar13;
    auVar14._12_4_ = iVar13;
    uVar15 = auVar14._8_8_;
    piVar1 = this->m_cbb + lVar5;
    *piVar1 = iVar10 * 0x166e9 + 0x8000 >> 0x10;
    piVar1[1] = iVar11 * 0x166e9 + 0x8000 >> 0x10;
    piVar1[2] = (int)((auVar2._8_8_ & 0xffffffff) * 0x166e9) + 0x8000 >> 0x10;
    piVar1[3] = (int)((uVar15 & 0xffffffff) * 0x166e9) + 0x8000 >> 0x10;
    auVar3._4_4_ = iVar11;
    auVar3._0_4_ = iVar10;
    auVar3._8_4_ = iVar12;
    auVar3._12_4_ = iVar13;
    piVar1 = this->m_crg + lVar5;
    *piVar1 = iVar10 * 0x1c5a2 + 0x8000 >> 0x10;
    piVar1[1] = iVar11 * 0x1c5a2 + 0x8000 >> 0x10;
    piVar1[2] = (int)((auVar3._8_8_ & 0xffffffff) * 0x1c5a2) + 0x8000 >> 0x10;
    piVar1[3] = (int)((uVar15 & 0xffffffff) * 0x1c5a2) + 0x8000 >> 0x10;
    auVar4._4_4_ = iVar11;
    auVar4._0_4_ = iVar10;
    auVar4._8_4_ = iVar12;
    auVar4._12_4_ = iVar13;
    piVar1 = this->m_cbg + lVar5;
    *(ulong *)piVar1 = CONCAT44(iVar11 * -0xb6d2,iVar10 * -0xb6d2);
    piVar1[4] = (int)((auVar4._8_8_ & 0xffffffff) * 0xffff492e);
    piVar1[5] = (int)((uVar15 & 0xffffffff) * 0xffff492e);
    piVar1 = (int *)((long)&this->m_pScan_line_0 + lVar5 * 4);
    *piVar1 = iVar10 * -0x581a + 0x8000;
    piVar1[1] = iVar11 * -0x581a + 0x8000;
    piVar1[2] = iVar12 * -0x581a + 0x8000;
    piVar1[3] = (int)((uVar15 & 0xffffffff) * 0xffffa7e6) + 0x8000;
    iVar8 = iVar8 + 4;
    iVar9 = iVar9 + 4;
    iVar6 = iVar6 + 4;
    iVar7 = iVar7 + 4;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0);
  return;
}

Assistant:

void jpeg_decoder::create_look_ups()
	{
		for (int i = 0; i <= 255; i++)
		{
			int k = i - 128;
			m_crr[i] = (FIX(1.40200f) * k + ONE_HALF) >> SCALEBITS;
			m_cbb[i] = (FIX(1.77200f) * k + ONE_HALF) >> SCALEBITS;
			m_crg[i] = (-FIX(0.71414f)) * k;
			m_cbg[i] = (-FIX(0.34414f)) * k + ONE_HALF;
		}
	}